

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int solution(set<int,_std::less<int>,_std::allocator<int>_> *nodes,
            map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
            *inc,map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
                 *r_inc)

{
  _Rb_tree_node_base *__k;
  size_t *this;
  int iVar1;
  _List_node_base *__k_00;
  _Self __tmp_2;
  _List_node_base *p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  mapped_type *__x;
  mapped_type *pmVar6;
  int iVar7;
  _Self __tmp_1;
  undefined1 auVar8 [8];
  int iVar9;
  _Self __tmp;
  undefined1 local_a8 [8];
  list<int,_std::allocator<int>_> l;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> n;
  undefined1 local_48 [8];
  list<int,_std::allocator<int>_> starts;
  
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&n;
  n._M_t._M_impl._0_4_ = 0;
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  n._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_48 = (undefined1  [8])local_48;
  starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)0x0;
  n._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)local_48;
  for (p_Var4 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(nodes->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    __k = p_Var4 + 1;
    p_Var2 = (_List_node_base *)
             std::
             map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
             ::operator[](r_inc,(key_type *)__k);
    if ((((_List_base<int,_std::allocator<int>_> *)&p_Var2->_M_next)->_M_impl)._M_node.
        super__List_node_base._M_next == p_Var2) {
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)local_48,(value_type *)__k);
      pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&l.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size,
                          (key_type *)__k);
      *pmVar3 = 1;
    }
  }
  if ((undefined1  [8])local_48 != local_48) {
    this = &l.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    auVar8 = local_48;
    while (p_Var2 = (_List_node_base *)local_a8, (undefined1  [8])local_48 != auVar8) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"process ");
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,*(int *)&((_List_node_base *)((long)auVar8 + 0x10))->_M_next);
      std::endl<char,std::char_traits<char>>(poVar5);
      n._M_t._M_impl.super__Rb_tree_header._M_node_count = (long)auVar8 + 0x10;
      __x = std::
            map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
            ::operator[](inc,(key_type *)n._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::list<int,_std::allocator<int>_>::list
                ((list<int,_std::allocator<int>_> *)p_Var2,__x);
      while( true ) {
        p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&p_Var2->_M_next)->_M_impl)._M_node.
                 super__List_node_base._M_next;
        if (p_Var2 == (_List_node_base *)local_a8) break;
        __k_00 = p_Var2 + 1;
        pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)this,(key_type *)__k_00);
        if (*pmVar3 == 0) {
          std::__cxx11::list<int,_std::allocator<int>_>::push_back
                    ((list<int,_std::allocator<int>_> *)local_48,(value_type *)__k_00);
        }
        pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)this,(key_type *)__k_00);
        pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)this,(key_type *)n._M_t._M_impl.super__Rb_tree_header._M_node_count);
        iVar7 = *pmVar6;
        iVar1 = *pmVar3;
        pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)this,(key_type *)__k_00);
        iVar9 = iVar7 + 1;
        if (iVar7 + 1 < iVar1) {
          iVar9 = iVar1;
        }
        *pmVar3 = iVar9;
      }
      auVar8 = (undefined1  [8])((_List_node_base *)auVar8)->_M_next;
      std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
                ((_List_base<int,_std::allocator<int>_> *)local_a8);
    }
    iVar7 = 0;
    for (p_Var4 = n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 != (_Rb_tree_node_base *)&n; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if (iVar7 < *(int *)&p_Var4[1].field_0x4) {
        iVar7 = *(int *)&p_Var4[1].field_0x4;
      }
    }
    std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
              ((_List_base<int,_std::allocator<int>_> *)local_48);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)&l.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
    return iVar7;
  }
  __assert_fail("starts.end() != k",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/dwarfs/main.cpp"
                ,0x20,
                "int solution(std::set<int> &, std::map<int, std::list<int>> &, std::map<int, std::list<int>> &)"
               );
}

Assistant:

int solution(std::set<int>& nodes, std::map<int, std::list<int> >& inc, std::map<int, std::list<int> >& r_inc)
{
    std::map<int, int> n;
    std::list<int> starts;
    
    for (std::set<int>::const_iterator i = nodes.begin(); i != nodes.end(); i++)
    {
        if (r_inc[*i].empty())
        {
            starts.push_back(*i);
            n[*i] = 1;
        }
    }
    
    std::list<int>::const_iterator k = starts.begin();
    assert(starts.end() != k);
    while (starts.end() != k)
    {
        cerr << "process " << *k << endl;
        std::list<int> l = inc[*k];
        for (std::list<int>::const_iterator j = l.begin(); j != l.end(); j++)
        {
            if (0 == n[*j])
            {
                starts.push_back(*j);
            }
            n[*j] = std::max(n[*j], n[*k] + 1);
        }
        k++;
    }
    
    int max = 0;
    for (std::map<int, int>::const_iterator i = n.begin(); i != n.end(); i++)
    {
        if (i->second > max)
        {
            max = i->second;
        }
    }
    return max;
}